

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.h
# Opt level: O2

float CB_ALGS::get_cost_pred<false>
                (single_learner *scorer,cb_class *known_cost,example *ec,uint32_t index,
                uint32_t base)

{
  label_t lVar1;
  wclass *pwVar2;
  wclass *pwVar3;
  size_t sVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  size_t sVar8;
  bool bVar9;
  float fVar10;
  polyprediction p;
  label ld;
  
  lVar1 = (ec->l).multi;
  pwVar2 = (ec->l).cs.costs._end;
  pwVar3 = (ec->l).cs.costs.end_array;
  sVar4 = (ec->l).cs.costs.erase_count;
  fVar10 = 3.4028235e+38;
  if ((known_cost != (cb_class *)0x0) && (known_cost->action == index)) {
    fVar10 = known_cost->cost;
  }
  bVar9 = BASELINE::baseline_enabled(ec);
  BASELINE::set_baseline_enabled(ec);
  (ec->l).multi.label = (uint32_t)fVar10;
  (ec->l).simple.initial = 0.0;
  pfVar5 = (ec->pred).scalars._begin;
  pfVar6 = (ec->pred).scalars._end;
  pfVar7 = (ec->pred).scalars.end_array;
  sVar8 = (ec->pred).scalars.erase_count;
  LEARNER::learner<char,_example>::predict(scorer,ec,(ulong)((index + base) - 1));
  if (!bVar9) {
    BASELINE::reset_baseline_disabled(ec);
  }
  fVar10 = (ec->pred).scalar;
  (ec->pred).scalars.end_array = pfVar7;
  (ec->pred).scalars.erase_count = sVar8;
  (ec->pred).scalars._begin = pfVar5;
  (ec->pred).scalars._end = pfVar6;
  (ec->l).cs.costs.end_array = pwVar3;
  (ec->l).cs.costs.erase_count = sVar4;
  (ec->l).multi = lVar1;
  (ec->l).cs.costs._end = pwVar2;
  return fVar10;
}

Assistant:

float get_cost_pred(
    LEARNER::single_learner* scorer, CB::cb_class* known_cost, example& ec, uint32_t index, uint32_t base)
{
  CB::label ld = ec.l.cb;

  label_data simple_temp;
  simple_temp.initial = 0.;
  if (known_cost != nullptr && index == known_cost->action)
    simple_temp.label = known_cost->cost;
  else
    simple_temp.label = FLT_MAX;

  const bool baseline_enabled_old = BASELINE::baseline_enabled(&ec);
  BASELINE::set_baseline_enabled(&ec);
  ec.l.simple = simple_temp;
  polyprediction p = ec.pred;
  if (is_learn && known_cost != nullptr && index == known_cost->action)
  {
    float old_weight = ec.weight;
    ec.weight /= known_cost->probability;
    scorer->learn(ec, index - 1 + base);
    ec.weight = old_weight;
  }
  else
    scorer->predict(ec, index - 1 + base);

  if (!baseline_enabled_old)
    BASELINE::reset_baseline_disabled(&ec);
  float pred = ec.pred.scalar;
  ec.pred = p;

  ec.l.cb = ld;

  return pred;
}